

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

parser_error parse_mcat_include_base(parser *p)

{
  long *plVar1;
  char *name;
  monster_base *pmVar2;
  void *pvVar3;
  int local_2c;
  monster_base *b;
  ui_knowledge_parse_state *s;
  parser *p_local;
  
  plVar1 = (long *)parser_priv(p);
  if (plVar1 == (long *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                  ,0xcac,"enum parser_error parse_mcat_include_base(struct parser *)");
  }
  if (*plVar1 == 0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name = parser_getstr(p,"name");
    pmVar2 = lookup_monster_base(name);
    if (pmVar2 == (monster_base *)0x0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_MONSTER_BASE;
    }
    else {
      if ((*(int *)(*plVar1 + 0x24) < 0) || (*(int *)(*plVar1 + 0x28) < *(int *)(*plVar1 + 0x24))) {
        __assert_fail("s->categories->n_inc_bases >= 0 && s->categories->n_inc_bases <= s->categories->max_inc_bases"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                      ,0xcb5,"enum parser_error parse_mcat_include_base(struct parser *)");
      }
      if (*(int *)(*plVar1 + 0x24) == *(int *)(*plVar1 + 0x28)) {
        if (0x7ffffff < *(int *)(*plVar1 + 0x28)) {
          return PARSE_ERROR_TOO_MANY_ENTRIES;
        }
        if (*(int *)(*plVar1 + 0x28) == 0) {
          local_2c = 2;
        }
        else {
          local_2c = *(int *)(*plVar1 + 0x28) << 1;
        }
        *(int *)(*plVar1 + 0x28) = local_2c;
        pvVar3 = mem_realloc(*(void **)(*plVar1 + 0x10),(long)*(int *)(*plVar1 + 0x28) << 3);
        *(void **)(*plVar1 + 0x10) = pvVar3;
      }
      *(monster_base **)(*(long *)(*plVar1 + 0x10) + (long)*(int *)(*plVar1 + 0x24) * 8) = pmVar2;
      *(int *)(*plVar1 + 0x24) = *(int *)(*plVar1 + 0x24) + 1;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_mcat_include_base(struct parser *p)
{
	struct ui_knowledge_parse_state *s =
		(struct ui_knowledge_parse_state*) parser_priv(p);
	struct monster_base *b;

	assert(s);
	if (!s->categories) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	b = lookup_monster_base(parser_getstr(p, "name"));
	if (!b) {
		return PARSE_ERROR_INVALID_MONSTER_BASE;
	}
	assert(s->categories->n_inc_bases >= 0
		&& s->categories->n_inc_bases <= s->categories->max_inc_bases);
	if (s->categories->n_inc_bases == s->categories->max_inc_bases) {
		if (s->categories->max_inc_bases > INT_MAX
				/ (2 * (int) sizeof(struct monster_base*))) {
			return PARSE_ERROR_TOO_MANY_ENTRIES;
		}
		s->categories->max_inc_bases = (s->categories->max_inc_bases)
			? 2 * s->categories->max_inc_bases : 2;
		s->categories->inc_bases = mem_realloc(
			s->categories->inc_bases,
			s->categories->max_inc_bases
			* sizeof(struct monster_base*));
	}
	s->categories->inc_bases[s->categories->n_inc_bases] = b;
	++s->categories->n_inc_bases;

	return PARSE_ERROR_NONE;
}